

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::expression
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,
          vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *code,int pcStart)

{
  any *value;
  _func_void__Op_any_ptr__Arg_ptr *p_Var1;
  SelectionSet *this_00;
  pointer pTVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  _Elt_pointer pSVar6;
  uint uVar7;
  stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
  stack;
  Token instruction;
  vector<int,_std::allocator<int>_> bsSize;
  string local_128;
  SelectionSet local_108;
  SelectionSet local_e8;
  _Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> local_c8;
  Token local_70;
  NameFinder *local_58;
  SelectionSet *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  createSelectionSets(&local_108,this);
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::_M_initialize_map
            (&local_c8,0);
  local_50 = __return_storage_ptr__;
  SelectionSet::size(&local_48,&local_108);
  uVar4 = (ulong)(uint)pcStart;
  pTVar2 = (code->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = ((long)(code->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) * -0x5555555555555555;
  if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
    value = &local_70.value;
    local_58 = &this->nameFinder;
    uVar7 = pcStart + 1;
    do {
      local_70.tok = pTVar2[uVar4].tok;
      local_70.intValue = pTVar2[uVar4].intValue;
      local_70.value._M_storage._M_ptr = (void *)0x0;
      p_Var1 = pTVar2[uVar4].value._M_manager;
      if (p_Var1 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        local_70.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      }
      else {
        local_128._M_dataplus._M_p = (pointer)value;
        (*p_Var1)(2,&pTVar2[uVar4].value,(_Arg *)&local_128);
      }
      if (0x140b < local_70.tok) {
        if (local_70.tok < 0x3400) {
          if (local_70.tok == 0x140c) {
            hull((SelectionSet *)&local_128,this);
            std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
            emplace_back<OpenMD::SelectionSet>
                      ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)
                       &local_c8,(SelectionSet *)&local_128);
          }
          else {
            if (local_70.tok != 0x140d) goto switchD_00262661_caseD_406;
            alphaHullInstruction((SelectionSet *)&local_128,this,&local_70);
            std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
            emplace_back<OpenMD::SelectionSet>
                      ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)
                       &local_c8,(SelectionSet *)&local_128);
          }
        }
        else if (local_70.tok - 0x3400U < 6) {
          comparatorInstruction((SelectionSet *)&local_128,this,&local_70);
          std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
          emplace_back<OpenMD::SelectionSet>
                    ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_c8
                     ,(SelectionSet *)&local_128);
        }
        else {
          if (local_70.tok != 0x10400) goto switchD_00262661_caseD_406;
          indexInstruction((SelectionSet *)&local_128,this,value);
          std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
          emplace_back<OpenMD::SelectionSet>
                    ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_c8
                     ,(SelectionSet *)&local_128);
        }
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_128
                  );
        goto LAB_00262719;
      }
      if (0x463 < local_70.tok) {
        if (1 < local_70.tok - 0x464U) {
          if (local_70.tok != 0x1406) goto switchD_00262661_caseD_406;
          pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
          }
          withinInstruction(this,&local_70,pSVar6 + -1);
        }
        goto LAB_00262719;
      }
      switch(local_70.tok) {
      case 0x403:
        pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
                  (&local_108.bitsets_,&pSVar6[-1].bitsets_);
        std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::pop_back
                  ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_c8);
        pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        SelectionSet::andOperator(pSVar6 + -1,&local_108);
        break;
      case 0x404:
        pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
                  (&local_108.bitsets_,&pSVar6[-1].bitsets_);
        std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::pop_back
                  ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_c8);
        pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        SelectionSet::orOperator(pSVar6 + -1,&local_108);
        break;
      case 0x405:
        pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        SelectionSet::flip(pSVar6 + -1);
        break;
      case 0x409:
        allInstruction(&local_e8,this);
        goto LAB_00262956;
      case 0x40a:
        createSelectionSets(&local_e8,this);
LAB_00262956:
        local_128.field_2._M_allocated_capacity =
             (size_type)
             local_108.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_128._M_string_length =
             (size_type)
             local_108.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_128._M_dataplus._M_p =
             (pointer)local_108.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_108.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_e8.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_108.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_108.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_e8.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_e8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_128
                  );
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_e8.bitsets_);
        std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::push_back
                  ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_c8,
                   &local_108);
        break;
      case 0x40b:
        plVar3 = (long *)std::__any_caster<std::__cxx11::string>(value);
        if (plVar3 == (long *)0x0) {
          std::__throw_bad_any_cast();
        }
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_128,*plVar3,plVar3[1] + *plVar3);
        NameFinder::match(&local_e8,local_58,&local_128);
        std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
        emplace_back<OpenMD::SelectionSet>
                  ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_c8,
                   &local_e8);
LAB_00262a0b:
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_e8.bitsets_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        break;
      default:
        if (local_70.tok == 1) {
          plVar3 = (long *)std::__any_caster<std::__cxx11::string>(value);
          if (plVar3 == (long *)0x0) {
            std::__throw_bad_any_cast();
          }
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,*plVar3,plVar3[1] + *plVar3);
          lookupValue(&local_e8,this,&local_128);
          std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
          emplace_back<OpenMD::SelectionSet>
                    ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_c8
                     ,&local_e8);
          goto LAB_00262a0b;
        }
      case 0x406:
      case 0x407:
      case 0x408:
switchD_00262661_caseD_406:
        unrecognizedExpression(this);
      }
LAB_00262719:
      if (local_70.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_70.value._M_manager)(_Op_destroy,value,(_Arg *)0x0);
        local_70.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      }
      uVar4 = (ulong)uVar7;
      pTVar2 = (code->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(code->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
              -0x5555555555555555;
      uVar7 = uVar7 + 1;
    } while (uVar4 <= uVar5 && uVar5 - uVar4 != 0);
  }
  this_00 = local_50;
  if (((long)local_c8._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)local_c8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
      ((long)local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)local_c8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555
      + (((long)local_c8._M_impl.super__Deque_impl_data._M_finish._M_node -
          (long)local_c8._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
        (ulong)(local_c8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x15 != 1) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"atom expression compiler error - stack over/underflow","");
    snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_128._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pSVar6 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
            (&this_00->bitsets_,&pSVar6[-1].bitsets_);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::~deque
            ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_c8);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_108.bitsets_);
  return this_00;
}

Assistant:

SelectionSet SelectionEvaluator::expression(const std::vector<Token>& code,
                                              int pcStart) {
    SelectionSet bs = createSelectionSets();
    std::stack<SelectionSet> stack;
    vector<int> bsSize = bs.size();

    for (unsigned int pc = pcStart; pc < code.size(); ++pc) {
      Token instruction = code[pc];

      switch (instruction.tok) {
      case Token::expressionBegin:
        break;
      case Token::expressionEnd:
        break;
      case Token::all:
        bs = allInstruction();
        stack.push(bs);
        break;
      case Token::none:
        bs = createSelectionSets();
        stack.push(bs);
        break;
      case Token::opOr:
        bs = stack.top();
        stack.pop();
        stack.top() |= bs;
        break;
      case Token::opAnd:
        bs = stack.top();
        stack.pop();
        stack.top() &= bs;
        break;
      case Token::opNot:
        stack.top().flip();
        break;
      case Token::within:
        withinInstruction(instruction, stack.top());
        break;
      case Token::alphahull:
        stack.push(alphaHullInstruction(instruction));
        break;
      case Token::hull:
        stack.push(hull());
        break;
        // case Token::selected:
        //  stack.push(getSelectionSet());
        //  break;
      case Token::name:
        stack.push(
            nameInstruction(std::any_cast<std::string>(instruction.value)));
        break;
      case Token::index:
        stack.push(indexInstruction(instruction.value));
        break;
      case Token::identifier:
        stack.push(lookupValue(std::any_cast<std::string>(instruction.value)));
        break;
      case Token::opLT:
      case Token::opLE:
      case Token::opGE:
      case Token::opGT:
      case Token::opEQ:
      case Token::opNE:
        stack.push(comparatorInstruction(instruction));
        break;
      default:
        unrecognizedExpression();
      }
    }
    if (stack.size() != 1)
      evalError("atom expression compiler error - stack over/underflow");

    return stack.top();
  }